

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

void __thiscall
t_dart_generator::generate_service_server(t_dart_generator *this,t_service *tservice)

{
  string *__lhs;
  ofstream_with_content_based_conditional_update *os;
  int *piVar1;
  ostream *poVar2;
  pointer pptVar3;
  t_dart_generator *ptVar4;
  t_service *tservice_00;
  string class_name;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends;
  string extends_processor;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  _Vector_base<t_function_*,_std::allocator<t_function_*>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  allocator local_1d0 [32];
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_208,&tservice->functions_
            );
  os = &this->f_service_;
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar2 = std::operator<<(poVar2,
                           "typedef void ProcessFunction(int seqid, TProtocol iprot, TProtocol oprot);"
                          );
  std::operator<<(poVar2,(string *)&endl2_abi_cxx11_);
  std::__cxx11::string::string((string *)&local_1f0,"",local_1d0);
  std::__cxx11::string::string((string *)local_1d0,"",(allocator *)&local_248);
  if (tservice->extends_ != (t_service *)0x0) {
    get_ttype_class_name_abi_cxx11_(&local_248,this,&tservice->extends_->super_t_type);
    std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::operator+(&local_228," extends ",&local_1f0);
    std::operator+(&local_248,&local_228,"Processor");
    std::__cxx11::string::operator=((string *)local_1d0,(string *)&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_228);
  }
  __lhs = &(this->super_t_oop_generator).super_t_generator.service_name_;
  std::operator+(&local_248,__lhs,"Processor");
  ptVar4 = (t_dart_generator *)__lhs;
  std::__cxx11::string::string((string *)&local_90,(string *)__lhs);
  get_file_name(&local_70,ptVar4,&local_90);
  std::__cxx11::string::string((string *)&local_b0,(string *)&local_248);
  export_class_to_library(this,&local_70,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar2 = std::operator<<(poVar2,"class ");
  poVar2 = std::operator<<(poVar2,(string *)&local_248);
  poVar2 = std::operator<<(poVar2,(string *)local_1d0);
  std::operator<<(poVar2," implements TProcessor");
  std::__cxx11::string::string((string *)&local_d0," ",(allocator *)&local_228);
  scope_up(this,(ostream *)os,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar2 = std::operator<<(poVar2,(string *)&local_248);
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = std::operator<<(poVar2,(string *)__lhs);
  std::operator<<(poVar2," iface)");
  if (local_1f0._M_string_length != 0) {
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    std::operator<<((ostream *)os,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::operator<<(poVar2,": super(iface)");
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
  }
  std::__cxx11::string::string((string *)&local_f0," ",(allocator *)&local_228);
  scope_up(this,(ostream *)os,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  if (local_1f0._M_string_length == 0) {
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar2 = std::operator<<(poVar2,"iface_ = iface;");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  for (pptVar3 = local_208._M_impl.super__Vector_impl_data._M_start;
      pptVar3 != local_208._M_impl.super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar2 = std::operator<<(poVar2,"PROCESS_MAP[\"");
    poVar2 = std::operator<<(poVar2,(string *)&(*pptVar3)->name_);
    poVar2 = std::operator<<(poVar2,"\"] = ");
    ptVar4 = (t_dart_generator *)&(*pptVar3)->name_;
    std::__cxx11::string::string((string *)&local_50,(string *)ptVar4);
    get_member_name(&local_228,ptVar4,&local_50);
    poVar2 = std::operator<<(poVar2,(string *)&local_228);
    poVar2 = std::operator<<(poVar2,";");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::string((string *)&local_110,(string *)&endl2_abi_cxx11_);
  scope_down(this,(ostream *)os,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar2 = std::operator<<(poVar2,(string *)__lhs);
  poVar2 = std::operator<<(poVar2," iface_;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  if (local_1f0._M_string_length == 0) {
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar2 = std::operator<<(poVar2,"final Map<String, ProcessFunction> PROCESS_MAP = {};");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  std::operator<<((ostream *)os,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::operator<<(poVar2,"bool process(TProtocol iprot, TProtocol oprot)");
  std::__cxx11::string::string((string *)&local_130," ",(allocator *)&local_228);
  scope_up(this,(ostream *)os,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar2 = std::operator<<(poVar2,"TMessage msg = iprot.readMessageBegin();");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar2 = std::operator<<(poVar2,"ProcessFunction fn = PROCESS_MAP[msg.name];");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::operator<<(poVar2,"if (fn == null)");
  std::__cxx11::string::string((string *)&local_150," ",(allocator *)&local_228);
  scope_up(this,(ostream *)os,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar2 = std::operator<<(poVar2,"TProtocolUtil.skip(iprot, TType.STRUCT);");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar2 = std::operator<<(poVar2,"iprot.readMessageEnd();");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar2 = std::operator<<(poVar2,
                           "TApplicationError x = new TApplicationError(TApplicationErrorType.UNKNOWN_METHOD, \"Invalid method name: \'\"+msg.name+\"\'\");"
                          );
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar2 = std::operator<<(poVar2,
                           "oprot.writeMessageBegin(new TMessage(msg.name, TMessageType.EXCEPTION, msg.seqid));"
                          );
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar2 = std::operator<<(poVar2,"x.write(oprot);");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar2 = std::operator<<(poVar2,"oprot.writeMessageEnd();");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar2 = std::operator<<(poVar2,"oprot.transport.flush();");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar2 = std::operator<<(poVar2,"return true;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::string((string *)&local_170,(string *)&::endl_abi_cxx11_);
  scope_down(this,(ostream *)os,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar2 = std::operator<<(poVar2,"fn(msg.seqid, iprot, oprot);");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar2 = std::operator<<(poVar2,"return true;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::string((string *)&local_190,(string *)&endl2_abi_cxx11_);
  tservice_00 = (t_service *)os;
  scope_down(this,(ostream *)os,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  for (pptVar3 = local_208._M_impl.super__Vector_impl_data._M_start;
      pptVar3 != local_208._M_impl.super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
    generate_process_function(this,tservice_00,*pptVar3);
  }
  std::__cxx11::string::string((string *)&local_1b0,(string *)&endl2_abi_cxx11_);
  scope_down(this,(ostream *)os,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base(&local_208);
  return;
}

Assistant:

void t_dart_generator::generate_service_server(t_service* tservice) {
  // Generate the dispatch methods
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  // typedef
  indent(f_service_) << "typedef void ProcessFunction(int seqid, TProtocol iprot, TProtocol oprot);" << endl2;

  // Extends stuff
  string extends = "";
  string extends_processor = "";
  if (tservice->get_extends() != nullptr) {
    extends = get_ttype_class_name(tservice->get_extends());
    extends_processor = " extends " + extends + "Processor";
  }

  // Generate the header portion
  string class_name =  service_name_ + "Processor";
  export_class_to_library(get_file_name(service_name_), class_name);
  indent(f_service_) << "class " << class_name << extends_processor << " implements TProcessor";
  scope_up(f_service_);

  indent(f_service_) << class_name << "(" << service_name_ << " iface)";
  if (!extends.empty()) {
    indent_up();
    f_service_ << endl;
    indent(f_service_) << ": super(iface)";
    indent_down();
  }
  scope_up(f_service_);

  if (extends.empty()) {
    indent(f_service_) << "iface_ = iface;" << endl;
  }

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    indent(f_service_) << "PROCESS_MAP[\"" << (*f_iter)->get_name()
               << "\"] = " << get_member_name((*f_iter)->get_name()) << ";" << endl;
  }
  scope_down(f_service_, endl2);

  indent(f_service_) << service_name_ << " iface_;" << endl;

  if (extends.empty()) {
    indent(f_service_) << "final Map<String, ProcessFunction> PROCESS_MAP = {};" << endl;
  }

  f_service_ << endl;

  // Generate the server implementation
  indent(f_service_) << "bool process(TProtocol iprot, TProtocol oprot)";
  scope_up(f_service_);
  indent(f_service_) << "TMessage msg = iprot.readMessageBegin();" << endl;
  indent(f_service_) << "ProcessFunction fn = PROCESS_MAP[msg.name];" << endl;
  indent(f_service_) << "if (fn == null)";
  scope_up(f_service_);
  indent(f_service_) << "TProtocolUtil.skip(iprot, TType.STRUCT);" << endl;
  indent(f_service_) << "iprot.readMessageEnd();" << endl;
  indent(f_service_) << "TApplicationError x = new TApplicationError(TApplicationErrorType.UNKNOWN_METHOD, "
         "\"Invalid method name: '\"+msg.name+\"'\");" << endl;
  indent(f_service_) << "oprot.writeMessageBegin(new TMessage(msg.name, TMessageType.EXCEPTION, msg.seqid));" << endl;
  indent(f_service_) << "x.write(oprot);" << endl;
  indent(f_service_) << "oprot.writeMessageEnd();" << endl;
  indent(f_service_) << "oprot.transport.flush();" << endl;
  indent(f_service_) << "return true;" << endl;
  scope_down(f_service_);
  indent(f_service_) << "fn(msg.seqid, iprot, oprot);" << endl;
  indent(f_service_) << "return true;" << endl;
  scope_down(f_service_, endl2); // process function

  // Generate the process subfunctions
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    generate_process_function(tservice, *f_iter);
  }

  scope_down(f_service_, endl2); // class
}